

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int tx_elements_output_init
              (uint64_t satoshi,uchar *script,size_t script_len,uchar *asset,size_t asset_len,
              uchar *value,size_t value_len,uchar *nonce,size_t nonce_len,uchar *surjectionproof,
              size_t surjectionproof_len,uchar *rangeproof,size_t rangeproof_len,
              wally_tx_output *output,_Bool is_elements)

{
  uint8_t uVar1;
  int iVar2;
  uchar *__dest;
  bool bVar3;
  
  iVar2 = -2;
  if (((satoshi < 0x775f05a074001 || is_elements) && (script_len == 0) != (script != (uchar *)0x0))
      && output != (wally_tx_output *)0x0) {
    if (script_len == 0) {
      bVar3 = true;
      __dest = (uchar *)0x0;
    }
    else {
      __dest = (uchar *)wally_malloc(script_len);
      if (__dest != (uchar *)0x0) {
        memcpy(__dest,script,script_len);
      }
      bVar3 = __dest != (uchar *)0x0;
    }
    iVar2 = -3;
    if (bVar3) {
      uVar1 = output->features;
      output->features = '\0';
      iVar2 = tx_elements_output_commitment_init
                        (output,asset,asset_len,value,value_len,nonce,nonce_len,surjectionproof,
                         surjectionproof_len,rangeproof,rangeproof_len,is_elements);
      if (iVar2 == 0) {
        output->script = __dest;
        output->script_len = script_len;
        output->satoshi = satoshi;
        iVar2 = 0;
      }
      else {
        output->features = uVar1;
        clear_and_free(__dest,script_len);
      }
    }
  }
  return iVar2;
}

Assistant:

static int tx_elements_output_init(
    uint64_t satoshi,
    const unsigned char *script,
    size_t script_len,
    const unsigned char *asset,
    size_t asset_len,
    const unsigned char *value,
    size_t value_len,
    const unsigned char *nonce,
    size_t nonce_len,
    const unsigned char *surjectionproof,
    size_t surjectionproof_len,
    const unsigned char *rangeproof,
    size_t rangeproof_len,
    struct wally_tx_output *output,
    bool is_elements)
{
    int ret, old_features;
    unsigned char *new_script = NULL;

    if (BYTES_INVALID(script, script_len) || !output ||
        (satoshi > WALLY_SATOSHI_MAX && !is_elements))
        return WALLY_EINVAL;

    if (!clone_bytes(&new_script, script, script_len))
        return WALLY_ENOMEM;

    old_features = output->features;
    output->features = 0;
    if ((ret = tx_elements_output_commitment_init(output, asset, asset_len,
                                                  value, value_len,
                                                  nonce, nonce_len,
                                                  surjectionproof, surjectionproof_len,
                                                  rangeproof, rangeproof_len,
                                                  is_elements)) != WALLY_OK) {
        output->features = old_features;
        clear_and_free(new_script, script_len);
        return ret;
    }

    output->script = new_script;
    output->script_len = script_len;
    output->satoshi = satoshi;
    return WALLY_OK;
}